

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_28;
  
  pbVar1 = (tokens->it)._M_current;
  pbVar2 = (tokens->itEnd)._M_current;
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
            (&local_28,&tokens->m_tokenBuffer);
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  .m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00326bb0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_type = NoMatch;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = pbVar1;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pbVar2;
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
            (&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
              field_0.m_value.m_remainingTokens.m_tokenBuffer,&local_28);
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00326b58;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
            (&local_28);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
            ExeName::parse(std::string const&,
                           Detail::TokenStream const& tokens) const {
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, tokens));
        }